

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

void tpl_model_update_b(TplParams *tpl_data,int mi_row,int mi_col,BLOCK_SIZE bsize,int frame_idx,
                       int ref)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  int64_t iVar11;
  byte bVar12;
  byte bVar13;
  undefined7 in_register_00000009;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long *plVar18;
  uint uVar19;
  uint uVar20;
  undefined4 in_register_00000034;
  long lVar21;
  long lVar22;
  byte bVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  bool bVar31;
  uint in_stack_00000008;
  
  lVar21 = CONCAT44(in_register_00000034,mi_row);
  bVar7 = (byte)tpl_data;
  lVar4 = *(long *)(lVar21 + 8 + (ulong)(uint)ref * 0x60);
  iVar8 = (int)CONCAT71(in_register_00000009,bsize);
  lVar27 = (long)((iVar8 >> (bVar7 & 0x1f)) + (mi_col >> (bVar7 & 0x1f)) * *(int *)(lVar21 + 0x40))
           * 200;
  lVar22 = lVar4 + lVar27;
  lVar14 = (long)*(char *)((ulong)in_stack_00000008 + 0xc0 + lVar22);
  if ((-1 < lVar14) &&
     (lVar25 = (long)*(int *)((ulong)(uint)ref * 0x60 + lVar21 + 0x20 + lVar14 * 4), -1 < lVar25)) {
    lVar25 = lVar25 * 0x60;
    uVar19 = (uint)*(short *)(lVar22 + 0xa4 + lVar14 * 4);
    uVar30 = (uint)*(short *)(lVar22 + 0xa6 + lVar14 * 4);
    bVar23 = (byte)frame_idx;
    iVar28 = 4 << (""[bVar23] & 0x1f);
    iVar29 = 4 << (""[bVar23] & 0x1f);
    uVar19 = ((int)((uVar19 - ((int)~uVar19 >> 0x1f)) + 3) >> 3) + mi_col * 4;
    bVar12 = ""[bVar23] + 2;
    uVar30 = ((int)((uVar30 - ((int)~uVar30 >> 0x1f)) + 3) >> 3) + iVar8 * 4;
    bVar13 = ""[bVar23] + 2;
    iVar8 = iVar29 * iVar28;
    bVar31 = *(char *)(lVar4 + 0xc1 + lVar27) < '\0';
    lVar4 = lVar21 + lVar25;
    lVar14 = *(long *)(lVar21 + 8 + lVar25);
    bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bVar23];
    bVar23 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar23];
    plVar18 = (long *)(lVar22 + 0x30 + (ulong)(in_stack_00000008 == 0) * 8);
    if (bVar31) {
      plVar18 = (long *)(lVar22 + 8);
    }
    piVar10 = (int *)(lVar22 + 0x9c + (ulong)(in_stack_00000008 == 0) * 4);
    if (bVar31) {
      piVar10 = (int *)(lVar22 + 0x90);
    }
    iVar2 = *piVar10;
    iVar3 = *(int *)(lVar22 + 0x94);
    lVar21 = *(long *)(lVar22 + 0x48);
    lVar27 = *(long *)(lVar22 + 0x18);
    lVar25 = lVar27 - *plVar18;
    iVar11 = av1_delta_rate_cost(*(int64_t *)(lVar22 + 0x40),lVar27,*plVar18,iVar8);
    uVar24 = 0;
    do {
      uVar9 = ((uVar24 >> 1) + ((int)uVar19 >> (bVar12 & 0x1f))) * iVar29;
      iVar16 = 0;
      if ((uVar24 & 1) != 0) {
        iVar16 = iVar28;
      }
      if ((((-1 < (int)uVar9) && ((int)uVar9 < *(int *)(lVar4 + 0x4c) * 4)) &&
          (uVar17 = iVar16 + ((int)uVar30 >> (bVar13 & 0x1f)) * iVar28, -1 < (int)uVar17)) &&
         ((int)uVar17 < *(int *)(lVar4 + 0x50) * 4)) {
        uVar5 = uVar19;
        if ((int)uVar19 < (int)uVar9) {
          uVar5 = uVar9;
        }
        uVar26 = uVar19;
        if ((int)uVar9 < (int)uVar19) {
          uVar26 = uVar9;
        }
        uVar6 = uVar30;
        if ((int)uVar30 < (int)uVar17) {
          uVar6 = uVar17;
        }
        uVar20 = uVar30;
        if ((int)uVar17 < (int)uVar30) {
          uVar20 = uVar17;
        }
        lVar22 = (long)(int)(((uVar20 + iVar28) - uVar6) * ((uVar26 + iVar29) - uVar5));
        if ((int)(uVar20 + iVar28) <= (int)uVar6) {
          lVar22 = 0;
        }
        if ((int)(uVar26 + iVar29) <= (int)uVar5) {
          lVar22 = 0;
        }
        lVar15 = (long)(int)(((uVar17 >> (bVar13 & 0x1f)) * (uint)bVar23 >> (bVar7 & 0x1f)) +
                            ((uVar9 >> (bVar12 & 0x1f)) * (uint)bVar1 >> (bVar7 & 0x1f)) *
                            *(int *)(lVar4 + 0x40)) * 200;
        plVar18 = (long *)(lVar14 + 0x48 + lVar15);
        *plVar18 = *plVar18 +
                   (lVar22 * ((long)(((double)lVar25 / (double)lVar27) * (double)lVar21) + lVar25))
                   / (long)iVar8;
        plVar18 = (long *)(lVar14 + 0x40 + lVar15);
        *plVar18 = *plVar18 +
                   (lVar22 * (iVar11 + ((long)(iVar3 << 4) - (long)(iVar2 << 4)))) / (long)iVar8;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != 4);
  }
  return;
}

Assistant:

static inline void tpl_model_update_b(TplParams *const tpl_data, int mi_row,
                                      int mi_col, const BLOCK_SIZE bsize,
                                      int frame_idx, int ref) {
  TplDepFrame *tpl_frame_ptr = &tpl_data->tpl_frame[frame_idx];
  TplDepStats *tpl_ptr = tpl_frame_ptr->tpl_stats_ptr;
  TplDepFrame *tpl_frame = tpl_data->tpl_frame;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  TplDepStats *tpl_stats_ptr = &tpl_ptr[av1_tpl_ptr_pos(
      mi_row, mi_col, tpl_frame->stride, block_mis_log2)];

  int is_compound = tpl_stats_ptr->ref_frame_index[1] >= 0;

  if (tpl_stats_ptr->ref_frame_index[ref] < 0) return;
  const int ref_frame_index = tpl_stats_ptr->ref_frame_index[ref];
  TplDepFrame *ref_tpl_frame =
      &tpl_frame[tpl_frame[frame_idx].ref_map_index[ref_frame_index]];
  TplDepStats *ref_stats_ptr = ref_tpl_frame->tpl_stats_ptr;

  if (tpl_frame[frame_idx].ref_map_index[ref_frame_index] < 0) return;

  const FULLPEL_MV full_mv =
      get_fullmv_from_mv(&tpl_stats_ptr->mv[ref_frame_index].as_mv);
  const int ref_pos_row = mi_row * MI_SIZE + full_mv.row;
  const int ref_pos_col = mi_col * MI_SIZE + full_mv.col;

  const int bw = 4 << mi_size_wide_log2[bsize];
  const int bh = 4 << mi_size_high_log2[bsize];
  const int mi_height = mi_size_high[bsize];
  const int mi_width = mi_size_wide[bsize];
  const int pix_num = bw * bh;

  // top-left on grid block location in pixel
  int grid_pos_row_base = round_floor(ref_pos_row, bh) * bh;
  int grid_pos_col_base = round_floor(ref_pos_col, bw) * bw;
  int block;

  int64_t srcrf_dist = is_compound ? tpl_stats_ptr->cmp_recrf_dist[!ref]
                                   : tpl_stats_ptr->srcrf_dist;
  int64_t srcrf_rate =
      is_compound
          ? (tpl_stats_ptr->cmp_recrf_rate[!ref] << TPL_DEP_COST_SCALE_LOG2)
          : (tpl_stats_ptr->srcrf_rate << TPL_DEP_COST_SCALE_LOG2);

  int64_t cur_dep_dist = tpl_stats_ptr->recrf_dist - srcrf_dist;
  int64_t mc_dep_dist =
      (int64_t)(tpl_stats_ptr->mc_dep_dist *
                ((double)(tpl_stats_ptr->recrf_dist - srcrf_dist) /
                 tpl_stats_ptr->recrf_dist));
  int64_t delta_rate =
      (tpl_stats_ptr->recrf_rate << TPL_DEP_COST_SCALE_LOG2) - srcrf_rate;
  int64_t mc_dep_rate =
      av1_delta_rate_cost(tpl_stats_ptr->mc_dep_rate, tpl_stats_ptr->recrf_dist,
                          srcrf_dist, pix_num);

  for (block = 0; block < 4; ++block) {
    int grid_pos_row = grid_pos_row_base + bh * (block >> 1);
    int grid_pos_col = grid_pos_col_base + bw * (block & 0x01);

    if (grid_pos_row >= 0 && grid_pos_row < ref_tpl_frame->mi_rows * MI_SIZE &&
        grid_pos_col >= 0 && grid_pos_col < ref_tpl_frame->mi_cols * MI_SIZE) {
      int overlap_area = av1_get_overlap_area(grid_pos_row, grid_pos_col,
                                              ref_pos_row, ref_pos_col, bw, bh);
      int ref_mi_row = round_floor(grid_pos_row, bh) * mi_height;
      int ref_mi_col = round_floor(grid_pos_col, bw) * mi_width;
      assert((1 << block_mis_log2) == mi_height);
      assert((1 << block_mis_log2) == mi_width);
      TplDepStats *des_stats = &ref_stats_ptr[av1_tpl_ptr_pos(
          ref_mi_row, ref_mi_col, ref_tpl_frame->stride, block_mis_log2)];
      des_stats->mc_dep_dist +=
          ((cur_dep_dist + mc_dep_dist) * overlap_area) / pix_num;
      des_stats->mc_dep_rate +=
          ((delta_rate + mc_dep_rate) * overlap_area) / pix_num;
    }
  }
}